

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O0

pboolean p_uthread_set_priority(PUThread *thread,PUThreadPriority prio)

{
  int iVar1;
  pboolean pVar2;
  pint local_28;
  int local_24;
  pint native_prio;
  pint policy;
  sched_param sched;
  PUThreadPriority prio_local;
  PUThread *thread_local;
  
  if (thread == (PUThread *)0x0) {
    thread_local._4_4_ = 0;
  }
  else {
    policy = prio;
    _sched = thread;
    iVar1 = pthread_getschedparam(thread->hdl,&local_24,(sched_param *)&native_prio);
    if (iVar1 == 0) {
      pVar2 = pp_uthread_get_unix_priority(policy,&local_24,&local_28);
      if (pVar2 == 0) {
        printf("** Error: %s **\n",
               "PUThread::p_uthread_set_priority: pp_uthread_get_unix_priority() failed");
        thread_local._4_4_ = 0;
      }
      else {
        memset(&native_prio,0,4);
        native_prio = local_28;
        iVar1 = pthread_setschedparam(_sched->hdl,local_24,(sched_param *)&native_prio);
        if (iVar1 == 0) {
          (_sched->base).prio = policy;
          thread_local._4_4_ = 1;
        }
        else {
          printf("** Error: %s **\n",
                 "PUThread::p_uthread_set_priority: pthread_setschedparam() failed");
          thread_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("** Error: %s **\n","PUThread::p_uthread_set_priority: pthread_getschedparam() failed")
      ;
      thread_local._4_4_ = 0;
    }
  }
  return thread_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_uthread_set_priority (PUThread		*thread,
			PUThreadPriority	prio)
{
#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	struct sched_param	sched;
	pint			policy;
	pint			native_prio;
#endif

	if (P_UNLIKELY (thread == NULL))
		return FALSE;

#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	if (P_UNLIKELY (pthread_getschedparam (thread->hdl, &policy, &sched) != 0)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pthread_getschedparam() failed");
		return FALSE;
	}

	if (P_UNLIKELY (pp_uthread_get_unix_priority (prio, &policy, &native_prio) == FALSE)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pp_uthread_get_unix_priority() failed");
		return FALSE;
	}

	memset (&sched, 0, sizeof (sched));
	sched.sched_priority = native_prio;

	if (P_UNLIKELY (pthread_setschedparam (thread->hdl, policy, &sched) != 0)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pthread_setschedparam() failed");
		return FALSE;
	}
#endif

	thread->base.prio = prio;
	return TRUE;
}